

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall
pbrt::BinaryReader::read<pbrt::math::vec4i,std::allocator<pbrt::math::vec4i>,void>
          (BinaryReader *this,vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *vt)

{
  ulong uVar1;
  pointer puVar2;
  size_type __new_size;
  runtime_error *this_00;
  size_t __n;
  
  uVar1 = this->currentEntityOffset + 8;
  puVar2 = (this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    __new_size = *(size_type *)(puVar2 + this->currentEntityOffset);
    this->currentEntityOffset = uVar1;
    std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::resize(vt,__new_size);
    __n = __new_size * 0x10;
    puVar2 = (this->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->currentEntityOffset + __n <=
        (ulong)((long)(this->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2)) {
      memcpy((vt->super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>)._M_impl
             .super__Vector_impl_data._M_start,puVar2 + this->currentEntityOffset,__n);
      this->currentEntityOffset = this->currentEntityOffset + __n;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void read(std::vector<T, A> &vt)
    {
      uint64_t length;
      read(length);
      vt.resize(length);
      copyBytes(vt.data(), length*sizeof(T));
    }